

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetector::deallocAllMemoryInCurrentAllocationStage(MemoryLeakDetector *this)

{
  char *memory_00;
  TestMemoryAllocator *allocator_00;
  TestMemoryAllocator *allocator;
  MemoryLeakDetectorNode *node;
  char *memory;
  MemoryLeakDetector *this_local;
  
  allocator = (TestMemoryAllocator *)
              MemoryLeakDetectorTable::getFirstLeakForAllocationStage
                        (&this->memoryTable_,this->current_allocation_stage_);
  while (allocator != (TestMemoryAllocator *)0x0) {
    memory_00 = allocator->alloc_name_;
    allocator_00 = (TestMemoryAllocator *)allocator[1]._vptr_TestMemoryAllocator;
    allocator = (TestMemoryAllocator *)
                MemoryLeakDetectorTable::getNextLeakForAllocationStage
                          (&this->memoryTable_,(MemoryLeakDetectorNode *)allocator,
                           this->current_allocation_stage_);
    deallocMemory(this,allocator_00,memory_00,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/MemoryLeakDetector.cpp"
                  ,0x2bf,false);
  }
  return;
}

Assistant:

void MemoryLeakDetector::deallocAllMemoryInCurrentAllocationStage()
{
    char* memory = NULLPTR;
    MemoryLeakDetectorNode* node = memoryTable_.getFirstLeakForAllocationStage(current_allocation_stage_);
    while (node) {
        memory = node->memory_;
        TestMemoryAllocator* allocator = node->allocator_;
        node = memoryTable_.getNextLeakForAllocationStage(node, current_allocation_stage_);
        deallocMemory(allocator, memory, __FILE__, __LINE__);
    }
}